

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

shared_ptr<helics::FilterOperator> __thiscall
helics::RerouteFilterOperation::getOperator(RerouteFilterOperation *this)

{
  shared_ptr<helics::FilterOperator> sVar1;
  
  sVar1 = std::static_pointer_cast<helics::FilterOperator,helics::MessageDestOperator>
                    ((shared_ptr<helics::MessageDestOperator> *)this);
  sVar1.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::FilterOperator>)
         sVar1.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FilterOperator> RerouteFilterOperation::getOperator()
{
    return std::static_pointer_cast<FilterOperator>(op);
}